

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O3

int eckey_verify_wrap(void *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,uchar *sig,
                     size_t sig_len)

{
  int iVar1;
  int iVar2;
  mbedtls_ecdsa_context ecdsa;
  mbedtls_ecdsa_context mStack_188;
  
  mbedtls_ecdsa_init(&mStack_188);
  iVar1 = mbedtls_ecdsa_from_keypair(&mStack_188,(mbedtls_ecp_keypair *)ctx);
  if (iVar1 == 0) {
    iVar2 = mbedtls_ecdsa_read_signature(&mStack_188,hash,hash_len,sig,sig_len);
    iVar1 = -0x3900;
    if (iVar2 != -0x4c00) {
      iVar1 = iVar2;
    }
  }
  mbedtls_ecdsa_free(&mStack_188);
  return iVar1;
}

Assistant:

static int eckey_verify_wrap( void *ctx, mbedtls_md_type_t md_alg,
                       const unsigned char *hash, size_t hash_len,
                       const unsigned char *sig, size_t sig_len )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecdsa_context ecdsa;

    mbedtls_ecdsa_init( &ecdsa );

    if( ( ret = mbedtls_ecdsa_from_keypair( &ecdsa, ctx ) ) == 0 )
        ret = ecdsa_verify_wrap( &ecdsa, md_alg, hash, hash_len, sig, sig_len );

    mbedtls_ecdsa_free( &ecdsa );

    return( ret );
}